

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall
BackwardPass::InstrPreservesNumberValues(BackwardPass *this,Instr *instr,Sym *defSym)

{
  bool bVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  Instr *pIVar4;
  BackwardPass *this_00;
  
  if (instr->m_opcode == Ld_A) {
    bVar1 = IR::Opnd::IsRegOpnd(instr->m_src1);
    if (bVar1) {
      pRVar3 = IR::Opnd::AsRegOpnd(instr->m_src1);
      pIVar4 = (pRVar3->m_sym->field_5).m_instrDef;
      if (pIVar4 == (Instr *)0x0) {
        pIVar4 = instr;
      }
      if ((pRVar3->m_sym->field_0x18 & 1) != 0) {
        instr = pIVar4;
      }
    }
  }
  this_00 = (BackwardPass *)(ulong)instr->m_opcode;
  bVar1 = OpCodeAttr::ProducesNumber(instr->m_opcode);
  bVar2 = true;
  if (!bVar1) {
    if (instr->m_opcode == Add_A) {
      bVar1 = SymIsIntconstOrSelf(this_00,defSym,instr->m_src1);
      if (bVar1) {
        bVar1 = SymIsIntconstOrSelf(this_00,defSym,instr->m_src2);
        return bVar1;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
BackwardPass::InstrPreservesNumberValues(IR::Instr *instr, Sym *defSym)
{
    if (instr->m_opcode == Js::OpCode::Ld_A)
    {
        if (instr->GetSrc1()->IsRegOpnd())
        {
            IR::RegOpnd *src1 = instr->GetSrc1()->AsRegOpnd();
            if (src1->m_sym->IsSingleDef())
            {
                instr = src1->m_sym->GetInstrDef();
            }
        }
    }
    return (OpCodeAttr::ProducesNumber(instr->m_opcode) ||
        (instr->m_opcode == Js::OpCode::Add_A && this->SymIsIntconstOrSelf(defSym, instr->GetSrc1()) && this->SymIsIntconstOrSelf(defSym, instr->GetSrc2())));
}